

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vli_encoder.c
# Opt level: O3

lzma_ret lzma_vli_encode(lzma_vli vli,size_t *vli_pos,uint8_t *out,size_t *out_pos,size_t out_size)

{
  ulong uVar1;
  lzma_ret lVar2;
  ulong uVar3;
  size_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  size_t vli_pos_internal;
  ulong local_10;
  
  local_10 = 0;
  psVar4 = vli_pos;
  if (vli_pos == (size_t *)0x0) {
    psVar4 = &local_10;
  }
  if (*out_pos < out_size) {
    uVar3 = *psVar4;
    lVar2 = LZMA_PROG_ERROR;
    if (-1 < (long)vli && uVar3 < 9) {
      uVar5 = vli >> ((char)uVar3 * '\a' & 0x3fU);
      uVar1 = *out_pos;
      do {
        uVar6 = uVar1 + 1;
        uVar3 = uVar3 + 1;
        if (uVar5 < 0x80) {
          out[uVar1] = (byte)uVar5;
          *out_pos = uVar6;
          *psVar4 = uVar3;
          return (uint)(psVar4 != &local_10);
        }
        *psVar4 = uVar3;
        if (8 < uVar3) {
          __assert_fail("*vli_pos < LZMA_VLI_BYTES_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/common/vli_encoder.c"
                        ,0x33,
                        "lzma_ret lzma_vli_encode(lzma_vli, size_t *, uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
        out[uVar1] = (byte)uVar5 | 0x80;
        uVar5 = uVar5 >> 7;
        *out_pos = uVar6;
        uVar1 = uVar6;
      } while (uVar6 != out_size);
      lVar2 = LZMA_PROG_ERROR;
      if (psVar4 != &local_10) {
        lVar2 = LZMA_OK;
      }
    }
  }
  else {
    lVar2 = vli_pos == (size_t *)0x0 | LZMA_BUF_ERROR;
  }
  return lVar2;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_vli_encode(lzma_vli vli, size_t *vli_pos,
		uint8_t *LZMA_RESTRICT out, size_t *LZMA_RESTRICT out_pos,
		size_t out_size)
{
	// If we haven't been given vli_pos, work in single-call mode.
	size_t vli_pos_internal = 0;
	if (vli_pos == NULL) {
		vli_pos = &vli_pos_internal;

		// In single-call mode, we expect that the caller has
		// reserved enough output space.
		if (*out_pos >= out_size)
			return LZMA_PROG_ERROR;
	} else {
		// This never happens when we are called by liblzma, but
		// may happen if called directly from an application.
		if (*out_pos >= out_size)
			return LZMA_BUF_ERROR;
	}

	// Validate the arguments.
	if (*vli_pos >= LZMA_VLI_BYTES_MAX || vli > LZMA_VLI_MAX)
		return LZMA_PROG_ERROR;

	// Shift vli so that the next bits to encode are the lowest. In
	// single-call mode this never changes vli since *vli_pos is zero.
	vli >>= *vli_pos * 7;

	// Write the non-last bytes in a loop.
	while (vli >= 0x80) {
		// We don't need *vli_pos during this function call anymore,
		// but update it here so that it is ready if we need to
		// return before the whole integer has been decoded.
		++*vli_pos;
		assert(*vli_pos < LZMA_VLI_BYTES_MAX);

		// Write the next byte.
		out[*out_pos] = (uint8_t)(vli) | 0x80;
		vli >>= 7;

		if (++*out_pos == out_size)
			return vli_pos == &vli_pos_internal
					? LZMA_PROG_ERROR : LZMA_OK;
	}

	// Write the last byte.
	out[*out_pos] = (uint8_t)(vli);
	++*out_pos;
	++*vli_pos;

	return vli_pos == &vli_pos_internal ? LZMA_OK : LZMA_STREAM_END;

}